

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# skeletal_mesh.h
# Opt level: O2

void __thiscall
SkeletalMesh::Scene::recursivelyGetTransf
          (Scene *this,SkeletonTransf *skTransf,SkeletonModifier *modifier,aiNode *node,
          aiMatrix4x4 parentTransf,aiMatrix4x4 *invTransf)

{
  char *__s;
  pointer pmVar1;
  col_type *pcVar2;
  _Rb_tree_color _Var3;
  pointer pmVar4;
  aiMatrix4x4 parentTransf_00;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  const_iterator cVar17;
  iterator iVar18;
  int i;
  ulong uVar19;
  aiMatrix4x4 boneMod;
  aiMatrix4x4 globalTransf;
  aiMatrix4x4 finalMtrx;
  aiMatrix4x4t<float> temp_1;
  undefined1 local_138 [32];
  undefined8 uStack_118;
  float local_110;
  float local_10c;
  float fStack_108;
  float fStack_104;
  float fStack_100;
  float local_fc;
  aiMatrix4x4 local_f8;
  aiMatrix4x4t<float> local_b8;
  aiMatrix4x4t<float> local_78;
  
  local_f8.d1 = parentTransf.d1;
  local_f8.d2 = parentTransf.d2;
  local_f8.d3 = parentTransf.d3;
  local_f8.d4 = parentTransf.d4;
  local_f8.c1 = parentTransf.c1;
  local_f8.c2 = parentTransf.c2;
  local_f8.c3 = parentTransf.c3;
  local_f8.c4 = parentTransf.c4;
  local_f8.b1 = parentTransf.b1;
  local_f8.b2 = parentTransf.b2;
  local_f8.b3 = parentTransf.b3;
  local_f8.b4 = parentTransf.b4;
  local_f8.a1 = parentTransf.a1;
  local_f8.a2 = parentTransf.a2;
  local_f8.a3 = parentTransf.a3;
  local_f8.a4 = parentTransf.a4;
  aiMatrix4x4t<float>::operator*=(&local_f8,&node->mTransformation);
  __s = (node->mName).data;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_138,__s,(allocator<char> *)&local_b8);
  cVar17 = std::
           _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
           ::find(&(this->nameBoneMap)._M_t,(key_type *)local_138);
  std::__cxx11::string::~string((string *)local_138);
  if ((_Rb_tree_header *)cVar17._M_node != &(this->nameBoneMap)._M_t._M_impl.super__Rb_tree_header)
  {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_138,__s,(allocator<char> *)&local_b8);
    iVar18 = std::
             _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_glm::mat<4,_4,_float,_(glm::qualifier)0>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_glm::mat<4,_4,_float,_(glm::qualifier)0>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_glm::mat<4,_4,_float,_(glm::qualifier)0>_>_>_>
             ::find(&modifier->_M_t,(key_type *)local_138);
    std::__cxx11::string::~string((string *)local_138);
    local_138._0_4_ = 1.0;
    local_138._4_4_ = 0.0;
    local_138._8_4_ = 0.0;
    local_138._12_4_ = 0.0;
    local_138._16_4_ = 0.0;
    local_138._20_4_ = 1.0;
    local_138._24_4_ = 0.0;
    local_138._28_4_ = 0.0;
    uStack_118._0_4_ = 0.0;
    uStack_118._4_4_ = 0.0;
    local_110 = 1.0;
    local_10c = 0.0;
    fStack_108 = 0.0;
    fStack_104 = 0.0;
    fStack_100 = 0.0;
    local_fc = 1.0;
    if ((_Rb_tree_header *)iVar18._M_node != &(modifier->_M_t)._M_impl.super__Rb_tree_header) {
      glm::detail::compute_transpose<4,_4,_float,_(glm::qualifier)0,_false>::call
                ((mat<4,_4,_float,_(glm::qualifier)0> *)(iVar18._M_node + 2));
      fStack_108 = local_b8.d1;
      fStack_104 = local_b8.d2;
      fStack_100 = local_b8.d3;
      local_fc = local_b8.d4;
      uStack_118._0_4_ = local_b8.c1;
      uStack_118._4_4_ = local_b8.c2;
      local_110 = local_b8.c3;
      local_10c = local_b8.c4;
      local_138._16_4_ = local_b8.b1;
      local_138._20_4_ = local_b8.b2;
      local_138._24_4_ = local_b8.b3;
      local_138._28_4_ = local_b8.b4;
      local_138._0_4_ = local_b8.a1;
      local_138._4_4_ = local_b8.a2;
      local_138._8_4_ = local_b8.a3;
      local_138._12_4_ = local_b8.a4;
      aiMatrix4x4t<float>::operator*=(&local_f8,(aiMatrix4x4t<float> *)local_138);
    }
    local_78.a1 = invTransf->a1;
    local_78.a2 = invTransf->a2;
    local_78.a3 = invTransf->a3;
    local_78.a4 = invTransf->a4;
    local_78.b1 = invTransf->b1;
    local_78.b2 = invTransf->b2;
    local_78.b3 = invTransf->b3;
    local_78.b4 = invTransf->b4;
    local_78.c1 = invTransf->c1;
    local_78.c2 = invTransf->c2;
    local_78.c3 = invTransf->c3;
    local_78.c4 = invTransf->c4;
    local_78.d1 = invTransf->d1;
    local_78.d2 = invTransf->d2;
    local_78.d3 = invTransf->d3;
    local_78.d4 = invTransf->d4;
    aiMatrix4x4t<float>::operator*=(&local_78,&local_f8);
    local_b8.d1 = local_78.d1;
    local_b8.d2 = local_78.d2;
    local_b8.d3 = local_78.d3;
    local_b8.d4 = local_78.d4;
    local_b8.c1 = local_78.c1;
    local_b8.c2 = local_78.c2;
    local_b8.c3 = local_78.c3;
    local_b8.c4 = local_78.c4;
    local_b8.b1 = local_78.b1;
    local_b8.b2 = local_78.b2;
    local_b8.b3 = local_78.b3;
    local_b8.b4 = local_78.b4;
    local_b8.a1 = local_78.a1;
    local_b8.a2 = local_78.a2;
    local_b8.a3 = local_78.a3;
    local_b8.a4 = local_78.a4;
    aiMatrix4x4t<float>::operator*=
              (&local_b8,
               &(this->skeleton).
                super__Vector_base<SkeletalMesh::Bone,_std::allocator<SkeletalMesh::Bone>_>._M_impl.
                super__Vector_impl_data._M_start[cVar17._M_node[2]._M_color].localTransf);
    _Var3 = cVar17._M_node[2]._M_color;
    pmVar4 = (skTransf->
             super__Vector_base<glm::mat<4,_4,_float,_(glm::qualifier)0>,_std::allocator<glm::mat<4,_4,_float,_(glm::qualifier)0>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    fVar8 = local_b8.b1;
    fVar5 = local_b8.a2;
    fVar6 = local_b8.a3;
    local_b8.b1 = local_b8.a2;
    local_b8.a2 = fVar8;
    fVar11 = local_b8.c1;
    fVar12 = local_b8.c2;
    fVar7 = local_b8.a4;
    fVar9 = local_b8.b3;
    local_b8.c2 = local_b8.b3;
    local_b8.c1 = local_b8.a3;
    fVar10 = local_b8.b4;
    fVar14 = local_b8.d1;
    fVar15 = local_b8.d2;
    local_b8.a4 = local_b8.d1;
    local_b8.a3 = fVar11;
    local_b8.d2 = local_b8.b4;
    local_b8.d1 = fVar7;
    local_b8.b4 = fVar15;
    local_b8.b3 = fVar12;
    fVar16 = local_b8.d3;
    fVar13 = local_b8.c4;
    local_b8.d3 = local_b8.c4;
    local_b8.c4 = fVar16;
    pcVar2 = pmVar4[_Var3].value + 3;
    pcVar2->field_0 = (anon_union_4_3_4e90da17_for_vec<4,_float,_(glm::qualifier)0>_3)fVar7;
    pcVar2->field_1 = (anon_union_4_3_4e90b0ec_for_vec<4,_float,_(glm::qualifier)0>_5)fVar10;
    pcVar2->field_2 = (anon_union_4_3_4e909dac_for_vec<4,_float,_(glm::qualifier)0>_7)fVar13;
    pcVar2->field_3 = (anon_union_4_3_4e909a07_for_vec<4,_float,_(glm::qualifier)0>_9)local_b8.d4;
    pcVar2 = pmVar4[_Var3].value + 1;
    pcVar2->field_0 = (anon_union_4_3_4e90da17_for_vec<4,_float,_(glm::qualifier)0>_3)fVar5;
    pcVar2->field_1 = (anon_union_4_3_4e90b0ec_for_vec<4,_float,_(glm::qualifier)0>_5)local_b8.b2;
    pcVar2->field_2 = (anon_union_4_3_4e909dac_for_vec<4,_float,_(glm::qualifier)0>_7)fVar12;
    pcVar2->field_3 = (anon_union_4_3_4e909a07_for_vec<4,_float,_(glm::qualifier)0>_9)fVar15;
    pmVar1 = pmVar4 + _Var3;
    pmVar1->value[0].field_0 =
         (anon_union_4_3_4e90da17_for_vec<4,_float,_(glm::qualifier)0>_3)local_b8.a1;
    pmVar1->value[0].field_1 = (anon_union_4_3_4e90b0ec_for_vec<4,_float,_(glm::qualifier)0>_5)fVar8
    ;
    pmVar1->value[0].field_2 =
         (anon_union_4_3_4e909dac_for_vec<4,_float,_(glm::qualifier)0>_7)fVar11;
    pmVar1->value[0].field_3 =
         (anon_union_4_3_4e909a07_for_vec<4,_float,_(glm::qualifier)0>_9)fVar14;
    pcVar2 = pmVar4[_Var3].value + 2;
    pcVar2->field_0 = (anon_union_4_3_4e90da17_for_vec<4,_float,_(glm::qualifier)0>_3)fVar6;
    pcVar2->field_1 = (anon_union_4_3_4e90b0ec_for_vec<4,_float,_(glm::qualifier)0>_5)fVar9;
    pcVar2->field_2 = (anon_union_4_3_4e909dac_for_vec<4,_float,_(glm::qualifier)0>_7)local_b8.c3;
    pcVar2->field_3 = (anon_union_4_3_4e909a07_for_vec<4,_float,_(glm::qualifier)0>_9)fVar16;
  }
  for (uVar19 = 0; uVar19 < node->mNumChildren; uVar19 = uVar19 + 1) {
    parentTransf_00.a3 = local_f8.a3;
    parentTransf_00.a4 = local_f8.a4;
    parentTransf_00.a1 = local_f8.a1;
    parentTransf_00.a2 = local_f8.a2;
    parentTransf_00.b1 = local_f8.b1;
    parentTransf_00.b2 = local_f8.b2;
    parentTransf_00.b3 = local_f8.b3;
    parentTransf_00.b4 = local_f8.b4;
    parentTransf_00.c1 = local_f8.c1;
    parentTransf_00.c2 = local_f8.c2;
    parentTransf_00.c3 = local_f8.c3;
    parentTransf_00.c4 = local_f8.c4;
    parentTransf_00.d1 = local_f8.d1;
    parentTransf_00.d2 = local_f8.d2;
    parentTransf_00.d3 = local_f8.d3;
    parentTransf_00.d4 = local_f8.d4;
    recursivelyGetTransf(this,skTransf,modifier,node->mChildren[uVar19],parentTransf_00,invTransf);
  }
  return;
}

Assistant:

void recursivelyGetTransf(SkeletonTransf &skTransf, SkeletonModifier &modifier, aiNode *node,
                                  aiMatrix4x4 parentTransf, const aiMatrix4x4 &invTransf) const {
            aiMatrix4x4 globalTransf = parentTransf * node->mTransformation;
            Name2Bone::const_iterator boneFound = nameBoneMap.find(std::string(node->mName.data));
            if (boneFound != nameBoneMap.end()) {
                SkeletonModifier::const_iterator boneModFound = modifier.find(std::string(node->mName.data));
                aiMatrix4x4 boneMod;
                if (boneModFound != modifier.end()) {
                    auto trans = glm::transpose(boneModFound->second);
                    memcpy(&boneMod, &trans, 16 * sizeof(float));
                    globalTransf *= boneMod;
                }
                aiMatrix4x4 finalMtrx = invTransf * globalTransf * skeleton[boneFound->second].localTransf;
                memcpy(&skTransf[boneFound->second], &finalMtrx.Transpose(), sizeof(skTransf[boneFound->second]));
            }
            for (int i = 0; i < node->mNumChildren; i++) {
                recursivelyGetTransf(skTransf, modifier, node->mChildren[i], globalTransf, invTransf);
            }
        }